

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

Xt __thiscall
cppforth::Forth::findDefinitionByWid(Forth *this,CAddr nameToFind,Cell nameLength,SCell wid)

{
  char cVar1;
  pointer pDVar2;
  int iVar3;
  size_type sVar4;
  Xt XVar5;
  char cVar6;
  pointer pDVar7;
  ulong __n;
  string Word1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (nameLength == 0) {
    XVar5 = 0;
  }
  else {
    __n = (ulong)nameLength;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,__n,' ');
    moveFromDataSpace(this,&local_50,nameToFind,__n);
    if (local_50._M_string_length != 0) {
      sVar4 = 0;
      do {
        cVar1 = local_50._M_dataplus._M_p[sVar4];
        cVar6 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar6 = cVar1;
        }
        local_50._M_dataplus._M_p[sVar4] = cVar6;
        sVar4 = sVar4 + 1;
      } while (local_50._M_string_length != sVar4);
    }
    pDVar2 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar7 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    XVar5 = 0;
    if (pDVar7 != pDVar2) {
      do {
        if (((((pDVar7[-1].flags & pDVar7[-1].FlagHidden) == 0) && (pDVar7[-1].searchOrder == wid))
            && (pDVar7[-1].name._M_string_length == __n)) &&
           (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_50,&pDVar7[-1].name), iVar3 == 0)) {
          XVar5 = pDVar7[-1].numberInVector;
          break;
        }
        pDVar7 = pDVar7 + -1;
        XVar5 = 0;
      } while (pDVar7 != pDVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return XVar5;
}

Assistant:

Xt findDefinitionByWid(CAddr nameToFind, Cell nameLength,SCell wid) {
			if (nameLength == 0)
				return 0;
			std::string Word1(nameLength,' ');
			moveFromDataSpace(Word1, nameToFind, nameLength);
			for (auto & c: Word1) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				if(defn.searchOrder!=wid)
				 	continue;		
				auto& name = defn.name;
				if(nameLength==name.length() && Word1.compare(name)==0) {
					return defn.numberInVector; 
				}
			}
			return 0;
		}